

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_grouping(lyout *out,int level,lys_node *node)

{
  lys_node_grp *grp;
  lys_node *sub;
  int flag;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  _flag = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  ly_print(out,"%*sgrouping %s",(ulong)(uint)(level << 1),"",node->name);
  node_local._4_4_ = node_local._4_4_ + 1;
  yang_print_snode_common(plStack_10,node_local._4_4_,_flag,_flag->module,(int *)&sub,0x71);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[3]; sub._4_4_ = sub._4_4_ + 1) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_typedef(plStack_10,node_local._4_4_,_flag->module,
                       (lys_tpdf *)(node[1].name + (long)sub._4_4_ * 0x80));
  }
  for (grp = (lys_node_grp *)_flag->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x800);
  }
  for (grp = (lys_node_grp *)_flag->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x903f);
  }
  for (grp = (lys_node_grp *)_flag->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x4000);
  }
  for (grp = (lys_node_grp *)_flag->child; grp != (lys_node_grp *)0x0;
      grp = (lys_node_grp *)grp->next) {
    yang_print_open(plStack_10,(int *)&sub);
    yang_print_snode(plStack_10,node_local._4_4_,(lys_node *)grp,0x80);
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yang_print_close(plStack_10,node_local._4_4_,(int)sub);
  return;
}

Assistant:

static void
yang_print_grouping(struct lyout *out, int level, const struct lys_node *node)
{
    int i, flag = 0;
    struct lys_node *sub;
    struct lys_node_grp *grp = (struct lys_node_grp *)node;

    ly_print(out, "%*sgrouping %s", LEVEL, INDENT, node->name);
    level++;

    yang_print_snode_common(out, level, node, node->module, &flag, SNODE_COMMON_EXT | SNODE_COMMON_STATUS |
                            SNODE_COMMON_DSC | SNODE_COMMON_REF);

    for (i = 0; i < grp->tpdf_size; i++) {
        yang_print_open(out, &flag);
        yang_print_typedef(out, level, node->module, &grp->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_GROUPING);
    }

    LY_TREE_FOR(node->child, sub) {
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                         LYS_USES | LYS_ANYDATA);
    }

    LY_TREE_FOR(node->child, sub) {
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_ACTION);
    }

    LY_TREE_FOR(node->child, sub) {
        yang_print_open(out, &flag);
        yang_print_snode(out, level, sub, LYS_NOTIF);
    }

    level--;
    yang_print_close(out, level, flag);
}